

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixmlparser.c
# Opt level: O1

int Parser_skipComment(char **pstrSrc)

{
  char *__haystack;
  char *pcVar1;
  int iVar2;
  
  __haystack = *pstrSrc;
  if (__haystack != (char *)0x0) {
    pcVar1 = strstr(__haystack,"-->");
    iVar2 = 0xc;
    if ((pcVar1 != __haystack && pcVar1 != (char *)0x0) && (pcVar1[-1] != '-')) {
      *pstrSrc = pcVar1 + 3;
      iVar2 = 0;
    }
    return iVar2;
  }
  __assert_fail("(*pstrSrc) != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/pupnp[P]pupnp/ixml/src/ixmlparser.c"
                ,0x28c,"int Parser_skipComment(char **)");
}

Assistant:

static int Parser_skipComment(
	/*! [in,out] The pointer to the skipped point. */
	char **pstrSrc)
{
	char *pStrFound = NULL;

	assert((*pstrSrc) != NULL);
	if (*pstrSrc == NULL) {
		return IXML_FAILED;
	}

	pStrFound = strstr(*pstrSrc, END_COMMENT);
	if ((pStrFound != NULL) && (pStrFound != *pstrSrc) &&
		(*(pStrFound - 1) != '-')) {
		*pstrSrc = pStrFound + strlen(END_COMMENT);
	} else {
		return IXML_SYNTAX_ERR;
	}

	return IXML_SUCCESS;
}